

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::setText(RuleBasedBreakIterator *this,UnicodeString *newText)

{
  UErrorCode local_1c;
  UnicodeString *pUStack_18;
  UErrorCode status;
  UnicodeString *newText_local;
  RuleBasedBreakIterator *this_local;
  
  local_1c = U_ZERO_ERROR;
  pUStack_18 = newText;
  newText_local = (UnicodeString *)this;
  BreakCache::reset(this->fBreakCache,0,0);
  DictionaryCache::reset(this->fDictionaryCache);
  utext_openConstUnicodeString_63(&this->fText,pUStack_18,&local_1c);
  StringCharacterIterator::setText(&this->fSCharIter,pUStack_18);
  if (((StringCharacterIterator *)this->fCharIter != &this->fSCharIter) &&
     (this->fCharIter != (CharacterIterator *)0x0)) {
    (*(this->fCharIter->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
  }
  this->fCharIter = (CharacterIterator *)&this->fSCharIter;
  (*(this->super_BreakIterator).super_UObject._vptr_UObject[10])();
  return;
}

Assistant:

void
RuleBasedBreakIterator::setText(const UnicodeString& newText) {
    UErrorCode status = U_ZERO_ERROR;
    fBreakCache->reset();
    fDictionaryCache->reset();
    utext_openConstUnicodeString(&fText, &newText, &status);

    // Set up a character iterator on the string.
    //   Needed in case someone calls getText().
    //  Can not, unfortunately, do this lazily on the (probably never)
    //  call to getText(), because getText is const.
    fSCharIter.setText(newText);

    if (fCharIter != &fSCharIter) {
        // old fCharIter was adopted from the outside.  Delete it.
        delete fCharIter;
    }
    fCharIter = &fSCharIter;

    this->first();
}